

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O2

ecs_type_t ecs_column_type(ecs_iter_t *it,int32_t index)

{
  ecs_type_t *ppeVar1;
  
  _ecs_assert(index <= it->column_count,2,(char *)0x0,"index <= it->column_count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xac);
  if (it->column_count < index) {
    __assert_fail("index <= it->column_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xac,"ecs_type_t ecs_column_type(const ecs_iter_t *, int32_t)");
  }
  _ecs_assert(0 < index,2,(char *)0x0,"index > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xad);
  if (index < 1) {
    __assert_fail("index > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xad,"ecs_type_t ecs_column_type(const ecs_iter_t *, int32_t)");
  }
  _ecs_assert(it->table != (ecs_iter_table_t *)0x0,0xc,(char *)0x0,"it->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xae);
  if (it->table == (ecs_iter_table_t *)0x0) {
    __assert_fail("it->table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                  ,0xae,"ecs_type_t ecs_column_type(const ecs_iter_t *, int32_t)");
  }
  _ecs_assert(it->table->types != (ecs_type_t *)0x0,0xc,(char *)0x0,"it->table->types != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xaf);
  ppeVar1 = it->table->types;
  if (ppeVar1 != (ecs_type_t *)0x0) {
    return ppeVar1[(ulong)(uint)index - 1];
  }
  __assert_fail("it->table->types != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                ,0xaf,"ecs_type_t ecs_column_type(const ecs_iter_t *, int32_t)");
}

Assistant:

ecs_type_t ecs_column_type(
    const ecs_iter_t *it,
    int32_t index)
{
    ecs_assert(index <= it->column_count, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(index > 0, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(it->table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(it->table->types != NULL, ECS_INTERNAL_ERROR, NULL);
    return it->table->types[index - 1];
}